

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9Texture.cpp
# Opt level: O0

GMM_STATUS __thiscall
GmmLib::GmmGen9TextureCalc::FillTex1D
          (GmmGen9TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,__GMM_BUFFER_TYPE *pRestrictions)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  SKU_FEATURE_TABLE *pSVar5;
  GMM_PLATFORM_INFO *pGVar6;
  uint32_t local_a0;
  uint32_t local_98;
  uint32_t local_94;
  uint32_t local_88;
  uint32_t local_7c;
  uint32_t local_6c;
  uint32_t AlignedMipWidth;
  GMM_PLATFORM_INFO *pPlatform;
  uint local_58;
  uint32_t CompressDepth;
  uint32_t CompressWidth;
  uint32_t CompressHeight;
  uint8_t Compressed;
  GMM_GFX_SIZE_T GStack_48;
  GMM_STATUS Status;
  int64_t Size;
  uint32_t MipWidth;
  uint32_t Width;
  uint32_t i;
  uint32_t HAlign;
  uint32_t BitsPerPixel;
  uint32_t ArraySize;
  __GMM_BUFFER_TYPE *pRestrictions_local;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmGen9TextureCalc *this_local;
  
  CompressHeight = 0;
  if (pTexInfo == (GMM_TEXTURE_INFO *)0x0) {
    this_local._4_4_ = GMM_ERROR;
  }
  else if (pRestrictions == (__GMM_BUFFER_TYPE *)0x0) {
    this_local._4_4_ = GMM_ERROR;
  }
  else {
    (pTexInfo->Flags).Info =
         (anon_struct_8_44_94931171_for_Info)
         ((ulong)(pTexInfo->Flags).Info & 0xfffffffffff7ffff | 0x80000);
    (pTexInfo->Flags).Info =
         (anon_struct_8_44_94931171_for_Info)((ulong)(pTexInfo->Flags).Info & 0xfffffffbffffffff);
    (pTexInfo->Flags).Info =
         (anon_struct_8_44_94931171_for_Info)((ulong)(pTexInfo->Flags).Info & 0xfffffff7ffffffff);
    _BitsPerPixel = pRestrictions;
    pRestrictions_local = (__GMM_BUFFER_TYPE *)pTexInfo;
    pTexInfo_local = (GMM_TEXTURE_INFO *)this;
    pSVar5 = Context::GetSkuTable((this->super_GmmTextureCalc).pGmmLibContext);
    if ((*(ushort *)&pSVar5->field_0 >> 6 & 1) == 0) {
      *(ulong *)&pRestrictions_local->field_0x14 =
           *(ulong *)&pRestrictions_local->field_0x14 & 0xfffff7ffffffffff;
    }
    else {
      *(ulong *)&pRestrictions_local->field_0x14 =
           *(ulong *)&pRestrictions_local->field_0x14 & 0xffffffefffffffff;
    }
    pGVar6 = GmmGetPlatformInfo((this->super_GmmTextureCalc).pGmmLibContext);
    if (*(uint *)((long)&pRestrictions_local->MinWidth + 4) < 2) {
      local_7c = 1;
    }
    else {
      local_7c = *(uint32_t *)((long)&pRestrictions_local->MinWidth + 4);
    }
    HAlign = local_7c;
    i = pRestrictions_local->RenderPitchAlignment;
    Width = pRestrictions_local->MaxDepth;
    CompressWidth._3_1_ =
         GmmIsCompressed((this->super_GmmTextureCalc).pGmmLibContext,
                         pRestrictions_local->PitchAlignment);
    GmmTextureCalc::GetCompressionBlockDimensions
              (&this->super_GmmTextureCalc,pRestrictions_local->PitchAlignment,&local_58,
               &CompressDepth,(uint32_t *)((long)&pPlatform + 4));
    if ((((*(ulong *)&pRestrictions_local->field_0x14 >> 0x25 & 1) != 0) ||
        ((*(ulong *)&pRestrictions_local->field_0x14 >> 0x26 & 1) != 0)) ||
       ((*(ulong *)&pRestrictions_local->field_0x14 >> 0x2c & 1) != 0)) {
      GmmTextureCalc::FindMipTailStartLod
                (&this->super_GmmTextureCalc,(GMM_TEXTURE_INFO *)pRestrictions_local);
    }
    Size._4_4_ = (uint32_t)pRestrictions_local->MinAllocationSize;
    if ((pRestrictions_local->PitchAlignment == 0x76) &&
       (((*(ulong *)&pRestrictions_local->field_0x14 >> 0x13 & 1) != 0 ||
        ((*(ulong *)&pRestrictions_local->field_0x14 >> 0x23 & 1) != 0)))) {
      Size._4_4_ = (Size._4_4_ + 0x3e) / 0x3f + Size._4_4_;
    }
    uVar1._0_4_ = pRestrictions_local->LockPitchAlignment;
    uVar1._4_4_ = pRestrictions_local->MinPitch;
    if (((uVar1 >> 6 & 1) == 0) &&
       (uVar2._0_4_ = pRestrictions_local->LockPitchAlignment,
       uVar2._4_4_ = pRestrictions_local->MinPitch, (uVar2 >> 0x1d & 1) == 0)) {
      local_88 = 1;
    }
    else {
      local_88 = *(uint32_t *)((long)&pRestrictions_local->MaxHeight + 4);
    }
    Size._0_4_ = GmmTextureCalc::ExpandWidth(&this->super_GmmTextureCalc,Size._4_4_,Width,local_88);
    Size._4_4_ = (uint32_t)Size;
    if (((((*(ulong *)&pRestrictions_local->field_0x14 >> 0x25 & 1) == 0) &&
         ((*(ulong *)&pRestrictions_local->field_0x14 >> 0x26 & 1) == 0)) &&
        ((*(ulong *)&pRestrictions_local->field_0x14 >> 0x2c & 1) == 0)) ||
       ((*(int *)&pRestrictions_local->field_0x5c != 0 && ((int)pRestrictions_local->MinWidth != 0))
       )) {
      for (MipWidth = 1; MipWidth <= (uint)pRestrictions_local->MinWidth; MipWidth = MipWidth + 1) {
        if (((((*(ulong *)&pRestrictions_local->field_0x14 >> 0x25 & 1) != 0) ||
             ((*(ulong *)&pRestrictions_local->field_0x14 >> 0x26 & 1) != 0)) ||
            ((*(ulong *)&pRestrictions_local->field_0x14 >> 0x2c & 1) != 0)) &&
           (MipWidth == *(uint32_t *)&pRestrictions_local->field_0x5c)) {
          Size._4_4_ = pGVar6->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalTileWidth +
                       Size._4_4_;
          break;
        }
        Size._0_4_ = (*(this->super_GmmTextureCalc)._vptr_GmmTextureCalc[0x18])
                               (this,pRestrictions_local,(ulong)MipWidth);
        uVar3._0_4_ = pRestrictions_local->LockPitchAlignment;
        uVar3._4_4_ = pRestrictions_local->MinPitch;
        if (((uVar3 >> 6 & 1) == 0) &&
           (uVar4._0_4_ = pRestrictions_local->LockPitchAlignment,
           uVar4._4_4_ = pRestrictions_local->MinPitch, (uVar4 >> 0x1d & 1) == 0)) {
          local_94 = 1;
        }
        else {
          local_94 = *(uint32_t *)((long)&pRestrictions_local->MaxHeight + 4);
        }
        local_6c = GmmTextureCalc::ExpandWidth
                             (&this->super_GmmTextureCalc,(uint32_t)Size,Width,local_94);
        if (CompressWidth._3_1_ != '\0') {
          local_6c = local_6c / local_58;
        }
        Size._4_4_ = local_6c + Size._4_4_;
      }
    }
    if (HAlign < 2) {
      local_98 = 0;
    }
    else {
      local_98 = Size._4_4_;
    }
    if (HAlign < 2) {
      local_a0 = 0;
    }
    else {
      local_a0 = Size._4_4_;
    }
    pRestrictions_local[1].LockPitchAlignment =
         (local_98 + (Width - 1)) - (local_a0 + (Width - 1) & Width - 1);
    pRestrictions_local[2].MinWidth = 0;
    Size._4_4_ = (i >> 3) * Size._4_4_;
    GStack_48 = ((ulong)Size._4_4_ * (ulong)HAlign + 0xfff) -
                ((ulong)Size._4_4_ * (ulong)HAlign + 0xfff & 0xfff);
    if (pGVar6->SurfaceMaxSize < (long)GStack_48) {
      CompressHeight = 1;
    }
    else {
      pRestrictions_local[2].MaxHeight = GStack_48;
      Fill1DTexOffsetAddress(this,(GMM_TEXTURE_INFO *)pRestrictions_local);
    }
    if ((*(int *)((long)&pRestrictions_local->MaxWidth + 4) == 0) ||
       (_BitsPerPixel->Alignment % *(uint *)((long)&pRestrictions_local->MaxWidth + 4) == 0)) {
      *(uint32_t *)((long)&pRestrictions_local->MaxWidth + 4) = _BitsPerPixel->Alignment;
    }
    else if (*(uint *)((long)&pRestrictions_local->MaxWidth + 4) % _BitsPerPixel->Alignment != 0) {
      *(uint32_t *)((long)&pRestrictions_local->MaxWidth + 4) =
           *(int *)((long)&pRestrictions_local->MaxWidth + 4) * _BitsPerPixel->Alignment;
    }
    this_local._4_4_ = CompressHeight;
  }
  return this_local._4_4_;
}

Assistant:

GMM_STATUS GMM_STDCALL GmmLib::GmmGen9TextureCalc::FillTex1D(GMM_TEXTURE_INFO * pTexInfo,
                                                             __GMM_BUFFER_TYPE *pRestrictions)
{
    uint32_t   ArraySize, BitsPerPixel, HAlign, i, Width, MipWidth;
    int64_t    Size;
    GMM_STATUS Status = GMM_SUCCESS;
    uint8_t    Compressed;
    uint32_t   CompressHeight, CompressWidth, CompressDepth;

    GMM_DPF_ENTER;

    __GMM_ASSERTPTR(pTexInfo, GMM_ERROR);
    __GMM_ASSERTPTR(pRestrictions, GMM_ERROR);
    __GMM_ASSERT(pTexInfo->Flags.Info.Linear ||
                 pTexInfo->Flags.Info.TiledYf ||
                 GMM_IS_64KB_TILE(pTexInfo->Flags));

    pTexInfo->Flags.Info.Linear = 1;
    pTexInfo->Flags.Info.TiledW = 0;
    pTexInfo->Flags.Info.TiledX = 0;
    GMM_SET_4KB_TILE(pTexInfo->Flags, 0, pGmmLibContext);

    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    ArraySize    = GFX_MAX(pTexInfo->ArraySize, 1);
    BitsPerPixel = pTexInfo->BitsPerPixel;
    HAlign       = pTexInfo->Alignment.HAlign;

    Compressed = GmmIsCompressed(pGmmLibContext, pTexInfo->Format);
    GetCompressionBlockDimensions(pTexInfo->Format, &CompressWidth, &CompressHeight, &CompressDepth);

    if(pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags))
    {
        FindMipTailStartLod(pTexInfo);
    }

    /////////////////////////////
    // Calculate Surface QPitch
    /////////////////////////////
    Width = GFX_ULONG_CAST(pTexInfo->BaseWidth);
    if((pTexInfo->Format == GMM_FORMAT_R8G8B8_UINT) && (pTexInfo->Flags.Info.Linear || pTexInfo->Flags.Info.TiledX))
    {
        Width += GFX_CEIL_DIV(Width, 63);
    }
    Width    = __GMM_EXPAND_WIDTH(this, Width, HAlign, pTexInfo);
    MipWidth = Width;

    if((pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags)) &&
       ((pTexInfo->Alignment.MipTailStartLod == 0) || (pTexInfo->MaxLod == 0)))
    {
        // Do nothing. Width is already aligned.
    }
    else
    {
        for(i = 1; i <= pTexInfo->MaxLod; i++)
        {
            uint32_t AlignedMipWidth;

            if((pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags)) &&
               (i == pTexInfo->Alignment.MipTailStartLod))
            {
                Width += pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileWidth;
                break;
            }
            else
            {
                MipWidth = GFX_ULONG_CAST(GmmTexGetMipWidth(pTexInfo, i));

                AlignedMipWidth = __GMM_EXPAND_WIDTH(this, MipWidth, HAlign, pTexInfo);

                if(Compressed)
                {
                    AlignedMipWidth /= CompressWidth;
                }

                Width += AlignedMipWidth;
            }
        }
    }

    pTexInfo->Alignment.QPitch = GFX_ALIGN((ArraySize > 1) ? Width : 0, HAlign); // in pixels

    pTexInfo->Pitch = 0;

    ///////////////////////////
    // Calculate Surface Size
    ///////////////////////////

    Width *= BitsPerPixel >> 3;

    Size = GFX_ALIGN((uint64_t)Width * ArraySize, PAGE_SIZE);

    if(Size <= pPlatform->SurfaceMaxSize)
    {
        pTexInfo->Size = Size;

        Fill1DTexOffsetAddress(pTexInfo);
    }
    else
    {
        GMM_ASSERTDPF(0, "Surface too large!");
        Status = GMM_ERROR;
    }

    //////////////////////
    // Surface Alignment
    //////////////////////

    if(!pTexInfo->Alignment.BaseAlignment || __GMM_IS_ALIGN(pRestrictions->Alignment, pTexInfo->Alignment.BaseAlignment))
    {
        pTexInfo->Alignment.BaseAlignment = pRestrictions->Alignment;
    }
    else if(__GMM_IS_ALIGN(pTexInfo->Alignment.BaseAlignment, pRestrictions->Alignment))
    {
        // Do nothing: pTexInfo->Alignment.BaseAlignment is properly aligned
    }
    else
    {
        pTexInfo->Alignment.BaseAlignment = pTexInfo->Alignment.BaseAlignment * pRestrictions->Alignment;
        GMM_ASSERTDPF(0,
                      "Client requested alignment that is not properly aligned to HW requirements."
                      "Alignment is going to be much higher to match both client and HW requirements.\r\n");
    }

    GMM_DPF_EXIT;

    return (Status);
}